

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *b)

{
  ArrayOptions *pAVar1;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  ulong uVar5;
  char16_t *pcVar6;
  long lVar7;
  ulong uVar8;
  char16_t *__dest;
  
  pDVar3 = (a->d).d;
  uVar5 = (a->d).size;
  uVar8 = (b->a).b.d.size + (b->a).a.d.size + uVar5 + 1;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)uVar5);
    pDVar3 = (a->d).d;
    uVar5 = (a->d).size;
    uVar2 = uVar8;
    if (pDVar3 != (Data *)0x0) goto LAB_00119f08;
LAB_00119f50:
    if (uVar2 < uVar5) {
      uVar2 = uVar5;
    }
    QString::reallocData((longlong)a,(AllocationOption)uVar2);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) {
      lVar4 = (pDVar3->super_QArrayData).alloc;
LAB_00119f73:
      if (lVar4 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_00119f7c;
    }
  }
  else {
LAB_00119f08:
    lVar4 = (pDVar3->super_QArrayData).alloc;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar4 - uVar5) - lVar7) < (long)uVar8) {
      uVar2 = lVar4 * 2;
      if (lVar4 * 2 < (long)uVar8) {
        uVar2 = uVar8;
      }
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar4 - lVar7 <= (long)uVar2)) goto LAB_00119f50;
      goto LAB_00119f73;
    }
LAB_00119f7c:
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00119f94;
  }
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_00119f94:
  __dest = (a->d).ptr + (a->d).size;
  lVar4 = (b->a).a.d.size;
  if (lVar4 != 0) {
    pcVar6 = (b->a).a.d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar6,lVar4 * 2);
  }
  lVar7 = (b->a).b.d.size;
  if (lVar7 != 0) {
    pcVar6 = (b->a).b.d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar4,pcVar6,lVar7 * 2);
  }
  (__dest + lVar4)[lVar7] = b->b;
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}